

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

void duckdb::BitStringAggOperation::
     Execute<duckdb::uhugeint_t,duckdb::BitAggState<duckdb::uhugeint_t>>
               (BitAggState<duckdb::uhugeint_t> *state,uhugeint_t input,uhugeint_t min)

{
  uint64_t uVar1;
  OutOfRangeException *this;
  bool bVar2;
  uint64_t extraout_RDX;
  uhugeint_t uVar3;
  allocator local_61;
  idx_t val;
  string local_58 [32];
  uhugeint_t min_local;
  uhugeint_t input_local;
  
  min_local.upper = min.upper;
  min_local.lower = min.lower;
  input_local.upper = input.upper;
  input_local.lower = input.lower;
  uVar1 = duckdb::uhugeint_t::operator-(&input_local,&min_local);
  uVar3.upper = extraout_RDX;
  uVar3.lower = uVar1;
  bVar2 = duckdb::Uhugeint::TryCast<unsigned_long>(uVar3,&val);
  if (bVar2) {
    duckdb::Bit::SetBit(&state->value,val,1);
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_58,"Range too large for bitstring aggregation",&local_61);
  duckdb::OutOfRangeException::OutOfRangeException(this,local_58);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BitStringAggOperation::Execute(BitAggState<uhugeint_t> &state, uhugeint_t input, uhugeint_t min) {
	idx_t val;
	if (Uhugeint::TryCast(input - min, val)) {
		Bit::SetBit(state.value, val, 1);
	} else {
		throw OutOfRangeException("Range too large for bitstring aggregation");
	}
}